

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,int jumpIfTrue,int jumpIfNull)

{
  int local_14c;
  undefined1 local_148 [4];
  int regFree1;
  Expr exprX;
  Expr compRight;
  Expr compLeft;
  Expr exprAnd;
  int jumpIfNull_local;
  int jumpIfTrue_local;
  int dest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  local_14c = 0;
  memcpy(local_148,pExpr->pLeft,0x48);
  compLeft.pTab._0_1_ = 0x45;
  compLeft.u.zToken = local_148;
  compLeft.pLeft = ((pExpr->x).pList)->a->pExpr;
  exprX.pTab._0_1_ = 0x4e;
  exprX.x._4_4_ = sqlite3ExprCodeTemp(pParse,(Expr *)local_148,&local_14c);
  local_148[0] = 0x84;
  if (jumpIfTrue == 0) {
    sqlite3ExprIfFalse(pParse,(Expr *)&compLeft.pTab,dest,jumpIfNull);
  }
  else {
    sqlite3ExprIfTrue(pParse,(Expr *)&compLeft.pTab,dest,jumpIfNull);
  }
  sqlite3ReleaseTempReg(pParse,local_14c);
  return;
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump here if the jump is taken */
  int jumpIfTrue,   /* Take the jump if the BETWEEN is true */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
  Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  Expr exprX;       /* The  x  subexpression */
  int regFree1 = 0; /* Temporary use register */

  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  exprX = *pExpr->pLeft;
  exprAnd.op = TK_AND;
  exprAnd.pLeft = &compLeft;
  exprAnd.pRight = &compRight;
  compLeft.op = TK_GE;
  compLeft.pLeft = &exprX;
  compLeft.pRight = pExpr->x.pList->a[0].pExpr;
  compRight.op = TK_LE;
  compRight.pLeft = &exprX;
  compRight.pRight = pExpr->x.pList->a[1].pExpr;
  exprX.iTable = sqlite3ExprCodeTemp(pParse, &exprX, &regFree1);
  exprX.op = TK_REGISTER;
  if( jumpIfTrue ){
    sqlite3ExprIfTrue(pParse, &exprAnd, dest, jumpIfNull);
  }else{
    sqlite3ExprIfFalse(pParse, &exprAnd, dest, jumpIfNull);
  }
  sqlite3ReleaseTempReg(pParse, regFree1);

  /* Ensure adequate test coverage */
  testcase( jumpIfTrue==0 && jumpIfNull==0 && regFree1==0 );
  testcase( jumpIfTrue==0 && jumpIfNull==0 && regFree1!=0 );
  testcase( jumpIfTrue==0 && jumpIfNull!=0 && regFree1==0 );
  testcase( jumpIfTrue==0 && jumpIfNull!=0 && regFree1!=0 );
  testcase( jumpIfTrue!=0 && jumpIfNull==0 && regFree1==0 );
  testcase( jumpIfTrue!=0 && jumpIfNull==0 && regFree1!=0 );
  testcase( jumpIfTrue!=0 && jumpIfNull!=0 && regFree1==0 );
  testcase( jumpIfTrue!=0 && jumpIfNull!=0 && regFree1!=0 );
}